

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyVisitor.cpp
# Opt level: O0

string * __thiscall OpenMD::LipidHeadVisitor::toString_abi_cxx11_(LipidHeadVisitor *this)

{
  bool bVar1;
  undefined8 uVar2;
  string *in_RDI;
  iterator i;
  char buffer [65535];
  string *result;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffeff68;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffeff70;
  char *__s;
  _Self _Stack_10048;
  _Base_ptr p_Stack_10040;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_10028;
  undefined1 uStack_10019;
  char acStack_10018 [65560];
  
  uStack_10019 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  std::
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Rb_tree_const_iterator(&_Stack_10028);
  snprintf(acStack_10018,0xffff,
           "------------------------------------------------------------------\n");
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  uVar2 = std::__cxx11::string::c_str();
  snprintf(acStack_10018,0xffff,"Visitor name: %s\n",uVar2);
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  snprintf(acStack_10018,0xffff,"lipidHeadName list contains below types:\n");
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  p_Stack_10040 =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffeff68);
  _Stack_10028._M_node = p_Stack_10040;
  while( true ) {
    _Stack_10048._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_stack_fffffffffffeff68);
    bVar1 = std::operator!=(&_Stack_10028,&_Stack_10048);
    if (!bVar1) break;
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x352478);
    uVar2 = std::__cxx11::string::c_str();
    snprintf(acStack_10018,0xffff,"%s\t",uVar2);
    std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(in_stack_fffffffffffeff70);
  }
  snprintf(acStack_10018,0xffff,"\n");
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  __s = acStack_10018;
  snprintf(__s,0xffff,"------------------------------------------------------------------\n");
  std::__cxx11::string::operator+=((string *)in_RDI,__s);
  return in_RDI;
}

Assistant:

const std::string LipidHeadVisitor::toString() {
    char buffer[65535];
    std::string result;
    std::set<std::string>::iterator i;

    snprintf(
        buffer, 65535,
        "------------------------------------------------------------------\n");
    result += buffer;

    snprintf(buffer, 65535, "Visitor name: %s\n", visitorName.c_str());
    result += buffer;

    // print the ignore type list
    snprintf(buffer, 65535, "lipidHeadName list contains below types:\n");
    result += buffer;

    for (i = lipidHeadName.begin(); i != lipidHeadName.end(); ++i) {
      snprintf(buffer, 65535, "%s\t", i->c_str());
      result += buffer;
    }

    snprintf(buffer, 65535, "\n");
    result += buffer;

    snprintf(
        buffer, 65535,
        "------------------------------------------------------------------\n");
    result += buffer;

    return result;
  }